

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O0

uint32 __thiscall
Clasp::Asp::LogicProgram::findBody
          (LogicProgram *this,uint32 hash,Body_t type,uint32 size,weight_t bound,WeightLit_t *sum)

{
  bool bVar1;
  uint uVar2;
  uint32 uVar3;
  PrgBody *this_00;
  uint in_ECX;
  E in_EDX;
  PrgBody *in_RDI;
  uint in_R8D;
  WeightLit_t *in_R9;
  PrgBody *b;
  IndexIter it;
  bool sorted;
  IndexRange bodies;
  PrgBody *in_stack_ffffffffffffff78;
  LogicProgram *in_stack_ffffffffffffff80;
  WeightLit_t *in_stack_ffffffffffffff88;
  Span<Potassco::WeightLit_t> in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  Body_t BVar4;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_48;
  byte local_39;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>_>
  local_38;
  WeightLit_t *local_28;
  uint local_1c;
  uint local_18;
  Body_t local_8 [2];
  
  local_28 = in_R9;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_8[0].val_ = in_EDX;
  local_38 = std::
             unordered_multimap<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::equal_range((unordered_multimap<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                            *)in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
  local_39 = 0;
  uVar2 = Potassco::Body_t::operator_cast_to_unsigned_int(local_8);
  if (uVar2 == 0) {
    local_1c = local_18;
  }
  local_48 = local_38.first.
             super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur;
  do {
    bVar1 = std::__detail::operator!=
                      (&local_48,
                       &local_38.second.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                      );
    if (!bVar1) {
      return 0x40000000;
    }
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
    operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false> *)0x182949
              );
    this_00 = getBody(in_stack_ffffffffffffff80,(Id_t)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    BVar4.val_ = local_8[0].val_;
    bVar1 = checkBody((LogicProgram *)in_stack_ffffffffffffff98.first,in_RDI,
                      (Body_t)in_stack_ffffffffffffff98.size._4_4_,
                      (uint32)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                      (weight_t)in_stack_ffffffffffffff88);
    if (bVar1) {
      in_stack_ffffffffffffff80 = (LogicProgram *)&in_RDI[6].field_0x8;
      in_stack_ffffffffffffff88 = (WeightLit_t *)PrgBody::goals_begin((PrgBody *)0x1829a2);
      PrgBody::goals_end((PrgBody *)in_stack_ffffffffffffff80);
      bVar1 = AtomState::inBody((AtomState *)in_stack_ffffffffffffff98.size,
                                (Literal *)in_stack_ffffffffffffff98.first,(Literal *)in_RDI);
      if (bVar1) {
        bVar1 = PrgBody::hasWeights((PrgBody *)in_stack_ffffffffffffff80);
        if (!bVar1) {
          uVar3 = PrgNode::id(&this_00->super_PrgNode);
          return uVar3;
        }
        if (local_28 != (WeightLit_t *)0x0) {
          if ((local_39 & 1) == 0) {
            std::sort<Potassco::WeightLit_t*>((WeightLit_t *)in_RDI,in_stack_ffffffffffffff88);
            local_39 = 1;
          }
          in_stack_ffffffffffffff78 = this_00;
          in_stack_ffffffffffffff98 =
               Potassco::toSpan<Potassco::WeightLit_t>(local_28,(ulong)local_18);
          bVar1 = equalLits((LogicProgram *)CONCAT44(BVar4.val_,in_stack_ffffffffffffffa8),
                            (PrgBody *)in_stack_ffffffffffffff98.size,
                            (WeightLitSpan *)in_stack_ffffffffffffff98.first);
          if (bVar1) {
            uVar3 = PrgNode::id(&this_00->super_PrgNode);
            return uVar3;
          }
        }
      }
    }
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false> *)
               in_stack_ffffffffffffff80);
  } while( true );
}

Assistant:

uint32 LogicProgram::findBody(uint32 hash, Body_t type, uint32 size, weight_t bound, Potassco::WeightLit_t* sum) {
	IndexRange bodies = index_->body.equal_range(hash);
	bool sorted = false;
	if (type == Body_t::Normal) { bound = static_cast<weight_t>(size); }
	for (IndexIter it = bodies.first; it != bodies.second; ++it) {
		const PrgBody& b = *getBody(it->second);
		if (!checkBody(b, type, size, bound) || !atomState_.inBody(b.goals_begin(), b.goals_end())) {
			continue;
		}
		else if (!b.hasWeights()) {
			return b.id();
		}
		else if (sum) {
			if (!sorted) {
				std::sort(sum, sum + size);
				sorted = true;
			}
			if (equalLits(b, Potassco::toSpan(sum, size))) { return b.id(); }
		}
	}
	return varMax;
}